

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

bool Diligent::ValidateResourceViewDimension<Diligent::TextureViewVkImpl>
               (char *ResName,Uint32 ArraySize,Uint32 ArrayInd,TextureViewVkImpl *pViewImpl,
               RESOURCE_DIMENSION ExpectedResourceDim,bool IsMultisample)

{
  RESOURCE_DIMENSION TexType;
  long lVar1;
  long *plVar2;
  Uint32 ArrayIndex;
  undefined7 in_register_00000081;
  String *Args_2;
  bool bVar3;
  string msg;
  String local_60;
  Char *local_40;
  Char *local_38;
  
  ArrayIndex = (Uint32)CONCAT71(in_register_00000081,ExpectedResourceDim);
  if (ArrayIndex == 0) {
    bVar3 = true;
  }
  else {
    if (pViewImpl == (TextureViewVkImpl *)0x0) {
      FormatString<char[26],char[20]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pTexView != nullptr",
                 (char (*) [20])0x0);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetResourceViewDimension",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    lVar1 = (**(code **)((long)(pViewImpl->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                               super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                               .super_ObjectBase<Diligent::ITextureViewVk>.
                               super_RefCountedObject<Diligent::ITextureViewVk>.super_ITextureViewVk
                               .super_ITextureView.super_IDeviceObject + 0x20))(pViewImpl);
    TexType = *(RESOURCE_DIMENSION *)(lVar1 + 9);
    bVar3 = TexType == ExpectedResourceDim;
    if (!bVar3) {
      GetShaderResourcePrintName_abi_cxx11_
                (&local_60,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
      local_40 = GetResourceDimString(TexType);
      local_38 = GetResourceDimString(ExpectedResourceDim);
      Args_2 = &local_60;
      FormatString<char[33],char_const*,char[22],std::__cxx11::string,char[6],char_const*,char[52],char_const*,char[2]>
                (&msg,(Diligent *)"The dimension of resource view \'",
                 (char (*) [33])
                 &(pViewImpl->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                  .m_Desc,(char **)"\' bound to variable \'",(char (*) [22])Args_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\' is ",
                 (char (*) [6])&local_40,
                 (char **)", but resource dimension expected by the shader is ",
                 (char (*) [52])&local_38,(char **)0x90e946,
                 (char (*) [2])CONCAT44(ArrayInd,ArraySize));
      ArrayIndex = (Uint32)Args_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidateResourceViewDimension",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x177);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if ((TexType & ~RESOURCE_DIM_BUFFER) == RESOURCE_DIM_TEX_2D) {
      plVar2 = (long *)(**(code **)((long)(pViewImpl->
                                          super_TextureViewBase<Diligent::EngineVkImplTraits>).
                                          super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                                          .super_ObjectBase<Diligent::ITextureViewVk>.
                                          super_RefCountedObject<Diligent::ITextureViewVk>.
                                          super_ITextureViewVk.super_ITextureView.
                                          super_IDeviceObject + 0x50))(pViewImpl);
      lVar1 = (**(code **)(*plVar2 + 0x20))(plVar2);
      if (IsMultisample && *(uint *)(lVar1 + 0x20) == 1) {
        GetShaderResourcePrintName_abi_cxx11_
                  (&local_60,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
        FormatString<char[15],char_const*,char[22],std::__cxx11::string,char[47]>
                  (&msg,(Diligent *)"Texture view \'",
                   (char (*) [15])
                   &(pViewImpl->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                    .m_Desc,(char **)"\' bound to variable \'",(char (*) [22])&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' is invalid: multisample texture is expected.",
                   (char (*) [47])CONCAT44(ArrayInd,ArraySize));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ValidateResourceViewDimension",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x181);
      }
      else {
        if (*(uint *)(lVar1 + 0x20) < 2 || IsMultisample) {
          return bVar3;
        }
        GetShaderResourcePrintName_abi_cxx11_
                  (&local_60,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
        FormatString<char[15],char_const*,char[22],std::__cxx11::string,char[49]>
                  (&msg,(Diligent *)"Texture view \'",
                   (char (*) [15])
                   &(pViewImpl->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                    .m_Desc,(char **)"\' bound to variable \'",(char (*) [22])&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' is invalid: single-sample texture is expected.",
                   (char (*) [49])CONCAT44(ArrayInd,ArraySize));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ValidateResourceViewDimension",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x187);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool ValidateResourceViewDimension(const char*                ResName,
                                   Uint32                     ArraySize,
                                   Uint32                     ArrayInd,
                                   const TextureViewImplType* pViewImpl,
                                   RESOURCE_DIMENSION         ExpectedResourceDim,
                                   bool                       IsMultisample)
{
    bool BindingsOK = true;

    if (ExpectedResourceDim != RESOURCE_DIM_UNDEFINED)
    {
        const RESOURCE_DIMENSION ResourceDim = GetResourceViewDimension(pViewImpl);
        if (ResourceDim != ExpectedResourceDim)
        {
            RESOURCE_VALIDATION_FAILURE("The dimension of resource view '", pViewImpl->GetDesc().Name,
                                        "' bound to variable '", GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is ", GetResourceDimString(ResourceDim),
                                        ", but resource dimension expected by the shader is ", GetResourceDimString(ExpectedResourceDim), ".");
            BindingsOK = false;
        }

        if (ResourceDim == RESOURCE_DIM_TEX_2D || ResourceDim == RESOURCE_DIM_TEX_2D_ARRAY)
        {
            Uint32 SampleCount = GetResourceSampleCount(pViewImpl);
            if (IsMultisample && SampleCount == 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: multisample texture is expected.");
                BindingsOK = false;
            }
            else if (!IsMultisample && SampleCount > 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: single-sample texture is expected.");
                BindingsOK = false;
            }
        }
    }

    return BindingsOK;
}